

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

uint NextProperty(TidyConfigImpl *config)

{
  tchar tVar1;
  Bool BVar2;
  bool bVar3;
  TidyConfigImpl *config_local;
  
  do {
    while( true ) {
      bVar3 = false;
      if ((config->c != 10) && (bVar3 = false, config->c != 0xd)) {
        bVar3 = config->c != 0xffffffff;
      }
      if (!bVar3) break;
      tVar1 = GetC(config);
      config->c = tVar1;
    }
    if (config->c == 0xd) {
      tVar1 = GetC(config);
      config->c = tVar1;
    }
    if (config->c == 10) {
      tVar1 = GetC(config);
      config->c = tVar1;
    }
    BVar2 = prvTidyIsWhite(config->c);
  } while (BVar2 != no);
  return config->c;
}

Assistant:

static uint NextProperty( TidyConfigImpl* config )
{
    do
    {
        /* skip to end of line */
        while ( config->c != '\n' &&  config->c != '\r' &&  config->c != EndOfStream )
             config->c = GetC( config );

        /* treat  \r\n   \r  or  \n as line ends */
        if ( config->c == '\r' )
             config->c = GetC( config );

        if ( config->c == '\n' )
            config->c = GetC( config );
    }
    while ( TY_(IsWhite)(config->c) );  /* line continuation? */

    return config->c;
}